

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectjson.cpp
# Opt level: O0

bool readFromFile(QFile *device,QJsonArray *allMetaObjects)

{
  ulong uVar1;
  bool bVar2;
  QString *this;
  char *pcVar3;
  QJsonValue *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QJsonDocument metaObjects;
  QJsonParseError error;
  QByteArray contents;
  QJsonParseError *in_stack_fffffffffffffee0;
  FILE *pFVar4;
  QString *in_stack_fffffffffffffee8;
  bool local_e1;
  QString local_d8;
  QIODevice *in_stack_ffffffffffffff48;
  QString local_a8 [2];
  undefined1 *local_78;
  undefined8 local_70;
  QString local_68 [2];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QIODevice::readAll(in_stack_ffffffffffffff48);
  bVar2 = QByteArray::isEmpty((QByteArray *)0x10680e);
  pFVar4 = _stderr;
  if (bVar2) {
    (**(code **)(*in_RDI + 0x98))(local_68);
    QtPrivate::asString(local_68);
    QString::toLocal8Bit(in_stack_fffffffffffffee8);
    pcVar3 = QByteArray::constData((QByteArray *)0x106866);
    fprintf(pFVar4,"%s:0: metatypes input file is empty\n",pcVar3);
    QByteArray::~QByteArray((QByteArray *)0x106889);
    QString::~QString((QString *)0x106896);
    local_e1 = false;
  }
  else {
    local_70 = 0xffffffff;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonDocument::fromJson((QByteArray *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    local_e1 = local_70._4_4_ == 0;
    if (local_e1) {
      QJsonDocument::object((QJsonDocument *)in_stack_fffffffffffffee8);
      QJsonValue::QJsonValue((QJsonValue *)in_stack_fffffffffffffee0,(QJsonObject *)in_RSI);
      QJsonArray::append((QJsonArray *)in_stack_fffffffffffffee0,in_RSI);
      QJsonValue::~QJsonValue((QJsonValue *)0x106a42);
      QJsonObject::~QJsonObject((QJsonObject *)0x106a4c);
    }
    else {
      pFVar4 = _stderr;
      (**(code **)(*in_RDI + 0x98))(local_a8);
      QtPrivate::asString(local_a8);
      QString::toLocal8Bit(in_stack_fffffffffffffee8);
      this = (QString *)QByteArray::constData((QByteArray *)0x106956);
      uVar1 = local_70;
      QJsonParseError::errorString((QJsonParseError *)pFVar4);
      QtPrivate::asString(&local_d8);
      QString::toLocal8Bit(this);
      pcVar3 = QByteArray::constData((QByteArray *)0x106999);
      fprintf(pFVar4,"%s:%d: %s\n",this,uVar1 & 0xffffffff,pcVar3);
      QByteArray::~QByteArray((QByteArray *)0x1069c2);
      QString::~QString((QString *)0x1069cc);
      QByteArray::~QByteArray((QByteArray *)0x1069d9);
      QString::~QString((QString *)0x1069e6);
    }
    QJsonDocument::~QJsonDocument((QJsonDocument *)0x106a66);
  }
  QByteArray::~QByteArray((QByteArray *)0x106a73);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_e1;
  }
  __stack_chk_fail();
}

Assistant:

static bool readFromFile(QFile *device, QJsonArray *allMetaObjects)
{
    const QByteArray contents = device->readAll();
    if (contents.isEmpty()) {
        fprintf(stderr, "%s:0: metatypes input file is empty\n", qPrintable(device->fileName()));
        return false;
    }

    QJsonParseError error {};
    QJsonDocument metaObjects = QJsonDocument::fromJson(contents, &error);
    if (error.error != QJsonParseError::NoError) {
        fprintf(stderr, "%s:%d: %s\n", qPrintable(device->fileName()), error.offset,
                qPrintable(error.errorString()));
        return false;
    }

    allMetaObjects->append(metaObjects.object());
    return true;
}